

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer *
Serialize<FSectorPortal,FSectorPortal>
          (FSerializer *arc,char *key,TArray<FSectorPortal,_FSectorPortal> *value,
          TArray<FSectorPortal,_FSectorPortal> *param_4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  FSectorPortal *port;
  uint local_38;
  uint i;
  bool res;
  TArray<FSectorPortal,_FSectorPortal> *param_3_local;
  TArray<FSectorPortal,_FSectorPortal> *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if ((!bVar1) || (uVar3 = TArray<FSectorPortal,_FSectorPortal>::Size(value), uVar3 != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    bVar2 = FSerializer::isReading(arc);
    if (bVar2) {
      if (!bVar1) {
        TArray<FSectorPortal,_FSectorPortal>::Clear(value);
        return arc;
      }
      uVar3 = FSerializer::ArraySize(arc);
      TArray<FSectorPortal,_FSectorPortal>::Resize(value,uVar3);
    }
    for (local_38 = 0; uVar3 = TArray<FSectorPortal,_FSectorPortal>::Size(value), local_38 < uVar3;
        local_38 = local_38 + 1) {
      port = TArray<FSectorPortal,_FSectorPortal>::operator[](value,(ulong)local_38);
      Serialize(arc,(char *)0x0,port,(FSectorPortal *)0x0);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}